

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

void __thiscall Omega_h::Write<long>::Write(Write<long> *this,HostWrite<long> *host_write)

{
  size_t in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  HostWrite<long> local_20;
  
  HostWrite<long>::write
            (&local_20,(int)host_write,(void *)CONCAT71(in_register_00000011,in_DL),in_RCX);
  (this->shared_alloc_).alloc = local_20.write_.shared_alloc_.alloc;
  (this->shared_alloc_).direct_ptr = local_20.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
       local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_20.write_.shared_alloc_.alloc)->use_count =
         (local_20.write_.shared_alloc_.alloc)->use_count + -1;
    (this->shared_alloc_).alloc = (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  return;
}

Assistant:

Write<T>::Write(HostWrite<T> host_write) : Write<T>(host_write.write()) {}